

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

int NGA_Sprs_array_get_block64
              (int s_a,int64_t irow,int64_t icol,int64_t **idx,int64_t **jdx,void **data,
              int64_t *ilo,int64_t *ihi,int64_t *jlo,int64_t *jhi)

{
  logical lVar1;
  void *jd;
  Integer jh;
  void *id;
  Integer jl;
  Integer ih;
  Integer il;
  
  lVar1 = pnga_sprs_array_get_block((long)s_a,irow,icol,&id,&jd,data,&il,&ih,&jl,&jh);
  *ilo = il + -1;
  *ihi = ih + -1;
  *jlo = jl + -1;
  *jhi = jh + -1;
  *idx = (int64_t *)id;
  *jdx = (int64_t *)jd;
  return (int)lVar1;
}

Assistant:

int NGA_Sprs_array_get_block64(int s_a, int64_t irow, int64_t icol,
    int64_t **idx, int64_t **jdx, void **data, int64_t *ilo,
    int64_t *ihi, int64_t *jlo, int64_t *jhi)
{
  Integer sa = (Integer)s_a;
  Integer ir = (Integer)irow;
  Integer ic = (Integer)icol;
  Integer il, ih, jl, jh;
  void *id, *jd;
  int ret = wnga_sprs_array_get_block(sa, ir, ic, &id, &jd, data,
      &il, &ih, &jl, &jh);
  *ilo = (int64_t)il-1;
  *ihi = (int64_t)ih-1;
  *jlo = (int64_t)jl-1;
  *jhi = (int64_t)jh-1;
  *idx = (int64_t*)id;
  *jdx = (int64_t*)jd;
  return ret;
}